

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

int __thiscall cmake::ActualConfigure(cmake *this)

{
  cmState *pcVar1;
  cmMakefile *this_00;
  _Alloc_hider __p;
  bool bVar2;
  int iVar3;
  string *psVar4;
  string *psVar5;
  cmGlobalGenerator *pcVar6;
  char *pcVar7;
  string fullName;
  allocator<char> local_49;
  string local_48;
  allocator<char> local_22;
  allocator<char> local_21;
  
  UpdateConversionPathTable(this);
  CleanupCommandsAndMacros(this);
  iVar3 = DoPreConfigureChecks(this);
  if (iVar3 < 0) {
    return -2;
  }
  if (iVar3 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fullName,"CMAKE_HOME_DIRECTORY",(allocator<char> *)&local_48);
    psVar4 = GetHomeDirectory_abi_cxx11_(this);
    AddCacheEntry(this,&fullName,(psVar4->_M_dataplus)._M_p,
                  "Source directory with the top level CMakeLists.txt file for this project",4);
    std::__cxx11::string::~string((string *)&fullName);
  }
  if (this->GlobalGenerator == (cmGlobalGenerator *)0x0) {
    pcVar1 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fullName,"CMAKE_GENERATOR",(allocator<char> *)&local_48);
    psVar4 = cmState::GetInitializedCacheValue(pcVar1,&fullName);
    std::__cxx11::string::~string((string *)&fullName);
    pcVar1 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fullName,"CMAKE_EXTRA_GENERATOR",(allocator<char> *)&local_48);
    psVar5 = cmState::GetInitializedCacheValue(pcVar1,&fullName);
    std::__cxx11::string::~string((string *)&fullName);
    if (psVar4 != (string *)0x0) {
      if (psVar5 == (string *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"",&local_21);
      }
      else {
        std::__cxx11::string::string((string *)&local_48,(string *)psVar5);
      }
      cmExternalMakefileProjectGenerator::CreateFullGeneratorName(&fullName,psVar4,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      pcVar6 = CreateGlobalGenerator(this,&fullName);
      this->GlobalGenerator = pcVar6;
      std::__cxx11::string::~string((string *)&fullName);
    }
    if (this->GlobalGenerator == (cmGlobalGenerator *)0x0) {
      CreateDefaultGlobalGenerator(this);
      if (this->GlobalGenerator == (cmGlobalGenerator *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&fullName,"Could not create generator",(allocator<char> *)&local_48);
        cmSystemTools::Error(&fullName);
        std::__cxx11::string::~string((string *)&fullName);
        return -1;
      }
    }
    else {
      cmSystemTools::s_ForceUnixPaths = this->GlobalGenerator->ForceUnixPaths;
    }
  }
  pcVar1 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
           super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
           super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fullName,"CMAKE_GENERATOR",(allocator<char> *)&local_48);
  psVar4 = cmState::GetInitializedCacheValue(pcVar1,&fullName);
  std::__cxx11::string::~string((string *)&fullName);
  if ((psVar4 != (string *)0x0) &&
     (iVar3 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[4])(this->GlobalGenerator,psVar4),
     (char)iVar3 == '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fullName,"Error: generator : ",(allocator<char> *)&local_48);
    (*this->GlobalGenerator->_vptr_cmGlobalGenerator[3])(&local_48);
    std::__cxx11::string::append((string *)&fullName);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::append((char *)&fullName);
    std::__cxx11::string::append((string *)&fullName);
    std::__cxx11::string::append((char *)&fullName);
    cmSystemTools::Error(&fullName);
LAB_001e2bac:
    std::__cxx11::string::~string((string *)&fullName);
    return -2;
  }
  pcVar1 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
           super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
           super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fullName,"CMAKE_GENERATOR",(allocator<char> *)&local_48);
  psVar4 = cmState::GetInitializedCacheValue(pcVar1,&fullName);
  std::__cxx11::string::~string((string *)&fullName);
  if (psVar4 == (string *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fullName,"CMAKE_GENERATOR",&local_49);
    (*this->GlobalGenerator->_vptr_cmGlobalGenerator[3])(&local_48);
    AddCacheEntry(this,&fullName,local_48._M_dataplus._M_p,"Name of generator.",4);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&fullName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fullName,"CMAKE_EXTRA_GENERATOR",&local_49);
    cmGlobalGenerator::GetExtraGeneratorName_abi_cxx11_(&local_48,this->GlobalGenerator);
    AddCacheEntry(this,&fullName,local_48._M_dataplus._M_p,
                  "Name of external makefile project generator.",4);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&fullName);
  }
  pcVar1 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
           super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
           super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fullName,"CMAKE_GENERATOR_INSTANCE",(allocator<char> *)&local_48);
  psVar4 = cmState::GetInitializedCacheValue(pcVar1,&fullName);
  std::__cxx11::string::~string((string *)&fullName);
  if (psVar4 == (string *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fullName,"CMAKE_GENERATOR_INSTANCE",(allocator<char> *)&local_48);
    AddCacheEntry(this,&fullName,(this->GeneratorInstance)._M_dataplus._M_p,
                  "Generator instance identifier.",4);
    std::__cxx11::string::~string((string *)&fullName);
  }
  else if ((this->GeneratorInstanceSet == true) &&
          (bVar2 = std::operator!=(&this->GeneratorInstance,psVar4), bVar2)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fullName,"Error: generator instance: ",(allocator<char> *)&local_48);
    std::__cxx11::string::append((string *)&fullName);
    std::__cxx11::string::append((char *)&fullName);
    std::__cxx11::string::append((string *)&fullName);
    std::__cxx11::string::append((char *)&fullName);
    cmSystemTools::Error(&fullName);
    goto LAB_001e2bac;
  }
  pcVar1 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
           super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
           super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fullName,"CMAKE_GENERATOR_PLATFORM",(allocator<char> *)&local_48);
  psVar4 = cmState::GetInitializedCacheValue(pcVar1,&fullName);
  std::__cxx11::string::~string((string *)&fullName);
  if (psVar4 == (string *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fullName,"CMAKE_GENERATOR_PLATFORM",(allocator<char> *)&local_48);
    AddCacheEntry(this,&fullName,(this->GeneratorPlatform)._M_dataplus._M_p,
                  "Name of generator platform.",4);
    std::__cxx11::string::~string((string *)&fullName);
  }
  else if ((this->GeneratorPlatformSet == true) &&
          (bVar2 = std::operator!=(&this->GeneratorPlatform,psVar4), bVar2)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fullName,"Error: generator platform: ",(allocator<char> *)&local_48);
    std::__cxx11::string::append((string *)&fullName);
    std::__cxx11::string::append((char *)&fullName);
    std::__cxx11::string::append((string *)&fullName);
    std::__cxx11::string::append((char *)&fullName);
    cmSystemTools::Error(&fullName);
    goto LAB_001e2bac;
  }
  pcVar1 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
           super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
           super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fullName,"CMAKE_GENERATOR_TOOLSET",(allocator<char> *)&local_48);
  psVar4 = cmState::GetInitializedCacheValue(pcVar1,&fullName);
  std::__cxx11::string::~string((string *)&fullName);
  if (psVar4 == (string *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fullName,"CMAKE_GENERATOR_TOOLSET",(allocator<char> *)&local_48);
    AddCacheEntry(this,&fullName,(this->GeneratorToolset)._M_dataplus._M_p,
                  "Name of generator toolset.",4);
    std::__cxx11::string::~string((string *)&fullName);
  }
  else if ((this->GeneratorToolsetSet == true) &&
          (bVar2 = std::operator!=(&this->GeneratorToolset,psVar4), bVar2)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fullName,"Error: generator toolset: ",(allocator<char> *)&local_48);
    std::__cxx11::string::append((string *)&fullName);
    std::__cxx11::string::append((char *)&fullName);
    std::__cxx11::string::append((string *)&fullName);
    std::__cxx11::string::append((char *)&fullName);
    cmSystemTools::Error(&fullName);
    goto LAB_001e2bac;
  }
  bVar2 = cmState::GetIsInTryCompile
                    ((this->State)._M_t.
                     super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                     super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                     super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
  if (!bVar2) {
    cmGlobalGenerator::ClearEnabledLanguages(this->GlobalGenerator);
    TruncateOutputLog(this,"CMakeOutput.log");
    TruncateOutputLog(this,"CMakeError.log");
  }
  local_48._M_dataplus._M_p = (pointer)this;
  std::make_unique<cmFileAPI,cmake*>((cmake **)&fullName);
  __p = fullName._M_dataplus;
  fullName._M_dataplus._M_p = (pointer)0x0;
  std::__uniq_ptr_impl<cmFileAPI,_std::default_delete<cmFileAPI>_>::reset
            ((__uniq_ptr_impl<cmFileAPI,_std::default_delete<cmFileAPI>_> *)&this->FileAPI,
             (pointer)__p._M_p);
  std::unique_ptr<cmFileAPI,_std::default_delete<cmFileAPI>_>::~unique_ptr
            ((unique_ptr<cmFileAPI,_std::default_delete<cmFileAPI>_> *)&fullName);
  cmFileAPI::ReadQueries
            ((this->FileAPI)._M_t.super___uniq_ptr_impl<cmFileAPI,_std::default_delete<cmFileAPI>_>.
             _M_t.super__Tuple_impl<0UL,_cmFileAPI_*,_std::default_delete<cmFileAPI>_>.
             super__Head_base<0UL,_cmFileAPI_*,_false>._M_head_impl);
  (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0xb])();
  pcVar1 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
           super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
           super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fullName,"CMAKE_BACKWARDS_COMPATIBILITY",(allocator<char> *)&local_48);
  psVar4 = cmState::GetInitializedCacheValue(pcVar1,&fullName);
  std::__cxx11::string::~string((string *)&fullName);
  if (psVar4 != (string *)0x0) {
    pcVar1 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fullName,"LIBRARY_OUTPUT_PATH",(allocator<char> *)&local_48);
    psVar4 = cmState::GetInitializedCacheValue(pcVar1,&fullName);
    std::__cxx11::string::~string((string *)&fullName);
    if (psVar4 == (string *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fullName,"LIBRARY_OUTPUT_PATH",(allocator<char> *)&local_48);
      AddCacheEntry(this,&fullName,"","Single output directory for building all libraries.",1);
      std::__cxx11::string::~string((string *)&fullName);
    }
    pcVar1 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fullName,"EXECUTABLE_OUTPUT_PATH",(allocator<char> *)&local_48);
    psVar4 = cmState::GetInitializedCacheValue(pcVar1,&fullName);
    std::__cxx11::string::~string((string *)&fullName);
    if (psVar4 == (string *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fullName,"EXECUTABLE_OUTPUT_PATH",(allocator<char> *)&local_48);
      AddCacheEntry(this,&fullName,"","Single output directory for building all executables.",1);
      std::__cxx11::string::~string((string *)&fullName);
    }
  }
  this_00 = *(this->GlobalGenerator->Makefiles).
             super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fullName,"CTEST_USE_LAUNCHERS",&local_49);
  bVar2 = cmMakefile::IsOn(this_00,&fullName);
  if (bVar2) {
    pcVar1 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"RULE_LAUNCH_COMPILE",&local_22);
    pcVar7 = cmState::GetGlobalProperty(pcVar1,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&fullName);
    if (pcVar7 != (char *)0x0) goto LAB_001e2e52;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fullName,
               "CTEST_USE_LAUNCHERS is enabled, but the RULE_LAUNCH_COMPILE global property is not defined.\nDid you forget to include(CTest) in the toplevel CMakeLists.txt ?"
               ,(allocator<char> *)&local_48);
    cmSystemTools::Error(&fullName);
  }
  std::__cxx11::string::~string((string *)&fullName);
LAB_001e2e52:
  pcVar1 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
           super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
           super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  psVar4 = GetHomeOutputDirectory_abi_cxx11_(this);
  cmState::SaveVerificationScript(pcVar1,psVar4);
  psVar4 = GetHomeOutputDirectory_abi_cxx11_(this);
  SaveCache(this,psVar4);
  bVar2 = cmSystemTools::GetErrorOccuredFlag();
  return -(uint)bVar2;
}

Assistant:

int cmake::ActualConfigure()
{
  // Construct right now our path conversion table before it's too late:
  this->UpdateConversionPathTable();
  this->CleanupCommandsAndMacros();

  int res = this->DoPreConfigureChecks();
  if (res < 0) {
    return -2;
  }
  if (!res) {
    this->AddCacheEntry(
      "CMAKE_HOME_DIRECTORY", this->GetHomeDirectory().c_str(),
      "Source directory with the top level CMakeLists.txt file for this "
      "project",
      cmStateEnums::INTERNAL);
  }

  // no generator specified on the command line
  if (!this->GlobalGenerator) {
    const std::string* genName =
      this->State->GetInitializedCacheValue("CMAKE_GENERATOR");
    const std::string* extraGenName =
      this->State->GetInitializedCacheValue("CMAKE_EXTRA_GENERATOR");
    if (genName) {
      std::string fullName =
        cmExternalMakefileProjectGenerator::CreateFullGeneratorName(
          *genName, extraGenName ? *extraGenName : "");
      this->GlobalGenerator = this->CreateGlobalGenerator(fullName);
    }
    if (this->GlobalGenerator) {
      // set the global flag for unix style paths on cmSystemTools as
      // soon as the generator is set.  This allows gmake to be used
      // on windows.
      cmSystemTools::SetForceUnixPaths(
        this->GlobalGenerator->GetForceUnixPaths());
    } else {
      this->CreateDefaultGlobalGenerator();
    }
    if (!this->GlobalGenerator) {
      cmSystemTools::Error("Could not create generator");
      return -1;
    }
  }

  const std::string* genName =
    this->State->GetInitializedCacheValue("CMAKE_GENERATOR");
  if (genName) {
    if (!this->GlobalGenerator->MatchesGeneratorName(*genName)) {
      std::string message = "Error: generator : ";
      message += this->GlobalGenerator->GetName();
      message += "\nDoes not match the generator used previously: ";
      message += *genName;
      message += "\nEither remove the CMakeCache.txt file and CMakeFiles "
                 "directory or choose a different binary directory.";
      cmSystemTools::Error(message);
      return -2;
    }
  }
  if (!this->State->GetInitializedCacheValue("CMAKE_GENERATOR")) {
    this->AddCacheEntry("CMAKE_GENERATOR",
                        this->GlobalGenerator->GetName().c_str(),
                        "Name of generator.", cmStateEnums::INTERNAL);
    this->AddCacheEntry("CMAKE_EXTRA_GENERATOR",
                        this->GlobalGenerator->GetExtraGeneratorName().c_str(),
                        "Name of external makefile project generator.",
                        cmStateEnums::INTERNAL);
  }

  if (const std::string* instance =
        this->State->GetInitializedCacheValue("CMAKE_GENERATOR_INSTANCE")) {
    if (this->GeneratorInstanceSet && this->GeneratorInstance != *instance) {
      std::string message = "Error: generator instance: ";
      message += this->GeneratorInstance;
      message += "\nDoes not match the instance used previously: ";
      message += *instance;
      message += "\nEither remove the CMakeCache.txt file and CMakeFiles "
                 "directory or choose a different binary directory.";
      cmSystemTools::Error(message);
      return -2;
    }
  } else {
    this->AddCacheEntry(
      "CMAKE_GENERATOR_INSTANCE", this->GeneratorInstance.c_str(),
      "Generator instance identifier.", cmStateEnums::INTERNAL);
  }

  if (const std::string* platformName =
        this->State->GetInitializedCacheValue("CMAKE_GENERATOR_PLATFORM")) {
    if (this->GeneratorPlatformSet &&
        this->GeneratorPlatform != *platformName) {
      std::string message = "Error: generator platform: ";
      message += this->GeneratorPlatform;
      message += "\nDoes not match the platform used previously: ";
      message += *platformName;
      message += "\nEither remove the CMakeCache.txt file and CMakeFiles "
                 "directory or choose a different binary directory.";
      cmSystemTools::Error(message);
      return -2;
    }
  } else {
    this->AddCacheEntry("CMAKE_GENERATOR_PLATFORM",
                        this->GeneratorPlatform.c_str(),
                        "Name of generator platform.", cmStateEnums::INTERNAL);
  }

  if (const std::string* tsName =
        this->State->GetInitializedCacheValue("CMAKE_GENERATOR_TOOLSET")) {
    if (this->GeneratorToolsetSet && this->GeneratorToolset != *tsName) {
      std::string message = "Error: generator toolset: ";
      message += this->GeneratorToolset;
      message += "\nDoes not match the toolset used previously: ";
      message += *tsName;
      message += "\nEither remove the CMakeCache.txt file and CMakeFiles "
                 "directory or choose a different binary directory.";
      cmSystemTools::Error(message);
      return -2;
    }
  } else {
    this->AddCacheEntry("CMAKE_GENERATOR_TOOLSET",
                        this->GeneratorToolset.c_str(),
                        "Name of generator toolset.", cmStateEnums::INTERNAL);
  }

  // reset any system configuration information, except for when we are
  // InTryCompile. With TryCompile the system info is taken from the parent's
  // info to save time
  if (!this->State->GetIsInTryCompile()) {
    this->GlobalGenerator->ClearEnabledLanguages();

    this->TruncateOutputLog("CMakeOutput.log");
    this->TruncateOutputLog("CMakeError.log");
  }

#if defined(CMAKE_BUILD_WITH_CMAKE)
  this->FileAPI = cm::make_unique<cmFileAPI>(this);
  this->FileAPI->ReadQueries();
#endif

  // actually do the configure
  this->GlobalGenerator->Configure();
  // Before saving the cache
  // if the project did not define one of the entries below, add them now
  // so users can edit the values in the cache:

  // We used to always present LIBRARY_OUTPUT_PATH and
  // EXECUTABLE_OUTPUT_PATH.  They are now documented as old-style and
  // should no longer be used.  Therefore we present them only if the
  // project requires compatibility with CMake 2.4.  We detect this
  // here by looking for the old CMAKE_BACKWARDS_COMPATIBILITY
  // variable created when CMP0001 is not set to NEW.
  if (this->State->GetInitializedCacheValue("CMAKE_BACKWARDS_COMPATIBILITY")) {
    if (!this->State->GetInitializedCacheValue("LIBRARY_OUTPUT_PATH")) {
      this->AddCacheEntry(
        "LIBRARY_OUTPUT_PATH", "",
        "Single output directory for building all libraries.",
        cmStateEnums::PATH);
    }
    if (!this->State->GetInitializedCacheValue("EXECUTABLE_OUTPUT_PATH")) {
      this->AddCacheEntry(
        "EXECUTABLE_OUTPUT_PATH", "",
        "Single output directory for building all executables.",
        cmStateEnums::PATH);
    }
  }

  cmMakefile* mf = this->GlobalGenerator->GetMakefiles()[0];
  if (mf->IsOn("CTEST_USE_LAUNCHERS") &&
      !this->State->GetGlobalProperty("RULE_LAUNCH_COMPILE")) {
    cmSystemTools::Error(
      "CTEST_USE_LAUNCHERS is enabled, but the "
      "RULE_LAUNCH_COMPILE global property is not defined.\n"
      "Did you forget to include(CTest) in the toplevel "
      "CMakeLists.txt ?");
  }

  this->State->SaveVerificationScript(this->GetHomeOutputDirectory());
  this->SaveCache(this->GetHomeOutputDirectory());
  if (cmSystemTools::GetErrorOccuredFlag()) {
    return -1;
  }
  return 0;
}